

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O1

double __thiscall
HighsLinearSumBounds::getResidualSumUpperOrig
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  int iVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sum];
  dVar4 = INFINITY;
  if (iVar1 == 1) {
    if (coefficient <= 0.0) {
      if (-INFINITY < this->varLower[var]) {
        return INFINITY;
      }
    }
    else if (this->varUpper[var] < INFINITY) {
      return INFINITY;
    }
    pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar4 = pHVar2[sum].hi + pHVar2[sum].lo;
  }
  else if (iVar1 == 0) {
    pHVar2 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar4 = pHVar2[sum].hi;
    if (coefficient <= 0.0) {
      pdVar3 = this->varLower;
    }
    else {
      pdVar3 = this->varUpper;
    }
    dVar5 = dVar4 - coefficient * pdVar3[var];
    return pHVar2[sum].lo +
           (-(coefficient * pdVar3[var]) - (dVar5 - dVar4)) + (dVar4 - (dVar5 - (dVar5 - dVar4))) +
           dVar5;
  }
  return dVar4;
}

Assistant:

double HighsLinearSumBounds::getResidualSumUpperOrig(HighsInt sum, HighsInt var,
                                                     double coefficient) const {
  switch (numInfSumUpperOrig[sum]) {
    case 0:
      if (coefficient > 0)
        return double(sumUpperOrig[sum] - varUpper[var] * coefficient);
      else
        return double(sumUpperOrig[sum] - varLower[var] * coefficient);
      break;
    case 1:
      if (coefficient > 0)
        return varUpper[var] == kHighsInf ? double(sumUpperOrig[sum])
                                          : kHighsInf;
      else
        return varLower[var] == -kHighsInf ? double(sumUpperOrig[sum])
                                           : kHighsInf;
      break;
    default:
      return kHighsInf;
  }
}